

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O0

void ImGui::ColorEditOptionsPopup(float *col,ImGuiColorEditFlags flags)

{
  bool bVar1;
  uint in_ESI;
  float *in_RDI;
  byte bVar2;
  byte bVar3;
  float fVar4;
  ImVec2 *in_stack_00000028;
  ImGuiSelectableFlags in_stack_00000030;
  bool in_stack_00000037;
  char *in_stack_00000038;
  char buf [64];
  int ca;
  int cb;
  int cg;
  int cr;
  ImGuiColorEditFlags opts;
  ImGuiContext *g;
  bool allow_opt_datatype;
  bool allow_opt_inputs;
  undefined4 in_stack_ffffffffffffff18;
  int iVar5;
  undefined4 in_stack_ffffffffffffff1c;
  undefined4 in_stack_ffffffffffffff20;
  ImGuiWindowFlags in_stack_ffffffffffffff24;
  char *in_stack_ffffffffffffff28;
  float local_bc;
  int local_94;
  ImVec2 local_90;
  ImVec2 local_88;
  ImVec2 local_80;
  char local_78 [68];
  int local_34;
  uint local_30;
  uint local_2c;
  uint local_28;
  ImVec2 local_24;
  uint local_1c;
  ImGuiContext *pIVar6;
  
  bVar2 = (in_ESI & 0x700000) == 0;
  bVar3 = (in_ESI & 0x1800000) == 0;
  if ((((bool)bVar2) || ((bool)bVar3)) &&
     (bVar1 = BeginPopup(in_stack_ffffffffffffff28,in_stack_ffffffffffffff24), bVar1)) {
    local_1c = GImGui->ColorEditOptions;
    pIVar6 = GImGui;
    if ((bVar2 & 1) != 0) {
      bVar1 = RadioButton(in_stack_00000038,in_stack_00000037);
      if (bVar1) {
        local_1c = local_1c & 0xff8fffff | 0x100000;
      }
      bVar1 = RadioButton(in_stack_00000038,in_stack_00000037);
      if (bVar1) {
        local_1c = local_1c & 0xff8fffff | 0x200000;
      }
      bVar1 = RadioButton(in_stack_00000038,in_stack_00000037);
      if (bVar1) {
        local_1c = local_1c & 0xff8fffff | 0x400000;
      }
    }
    if ((bVar3 & 1) != 0) {
      if ((bVar2 & 1) != 0) {
        Separator();
      }
      bVar1 = RadioButton(in_stack_00000038,in_stack_00000037);
      if (bVar1) {
        local_1c = local_1c & 0xfe7fffff | 0x800000;
      }
      bVar1 = RadioButton(in_stack_00000038,in_stack_00000037);
      if (bVar1) {
        local_1c = local_1c & 0xfe7fffff | 0x1000000;
      }
    }
    if (((bVar2 & 1) != 0) || ((bVar3 & 1) != 0)) {
      Separator();
    }
    ImVec2::ImVec2(&local_24,-1.0,0.0);
    bVar1 = Button((char *)CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20),
                   (ImVec2 *)CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18));
    if (bVar1) {
      OpenPopup((char *)CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20));
    }
    bVar1 = BeginPopup(in_stack_ffffffffffffff28,in_stack_ffffffffffffff24);
    if (bVar1) {
      fVar4 = ImSaturate(*in_RDI);
      local_28 = (uint)(fVar4 * 255.0 + 0.5);
      fVar4 = ImSaturate(in_RDI[1]);
      local_2c = (uint)(fVar4 * 255.0 + 0.5);
      fVar4 = ImSaturate(in_RDI[2]);
      local_30 = (uint)(fVar4 * 255.0 + 0.5);
      if ((in_ESI & 2) == 0) {
        fVar4 = ImSaturate(in_RDI[3]);
        local_94 = (int)(fVar4 * 255.0 + 0.5);
      }
      else {
        local_94 = 0xff;
      }
      local_34 = local_94;
      if ((in_ESI & 2) == 0) {
        local_bc = in_RDI[3];
      }
      else {
        local_bc = 1.0;
      }
      ImFormatString((char *)(double)*in_RDI,(size_t)(double)in_RDI[1],(char *)(double)in_RDI[2],
                     (double)local_bc,local_78,0x40,"(%.3ff, %.3ff, %.3ff, %.3ff)");
      ImVec2::ImVec2(&local_80,0.0,0.0);
      bVar1 = Selectable(in_stack_00000038,in_stack_00000037,in_stack_00000030,in_stack_00000028);
      if (bVar1) {
        SetClipboardText((char *)CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20));
      }
      iVar5 = local_34;
      ImFormatString(local_78,0x40,"(%d,%d,%d,%d)",(ulong)local_28,(ulong)local_2c,(ulong)local_30,
                     local_34);
      ImVec2::ImVec2(&local_88,0.0,0.0);
      bVar1 = Selectable(in_stack_00000038,in_stack_00000037,in_stack_00000030,in_stack_00000028);
      if (bVar1) {
        SetClipboardText((char *)CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20));
      }
      if ((in_ESI & 2) == 0) {
        ImFormatString(local_78,0x40,"0x%02X%02X%02X%02X",(ulong)local_28,(ulong)local_2c,
                       (ulong)local_30,local_34);
      }
      else {
        ImFormatString(local_78,0x40,"0x%02X%02X%02X",(ulong)local_28,(ulong)local_2c,
                       (ulong)local_30,iVar5);
      }
      ImVec2::ImVec2(&local_90,0.0,0.0);
      bVar1 = Selectable(in_stack_00000038,in_stack_00000037,in_stack_00000030,in_stack_00000028);
      if (bVar1) {
        SetClipboardText((char *)CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20));
      }
      EndPopup();
    }
    pIVar6->ColorEditOptions = local_1c;
    EndPopup();
  }
  return;
}

Assistant:

void ImGui::ColorEditOptionsPopup(const float* col, ImGuiColorEditFlags flags)
{
    bool allow_opt_inputs = !(flags & ImGuiColorEditFlags__DisplayMask);
    bool allow_opt_datatype = !(flags & ImGuiColorEditFlags__DataTypeMask);
    if ((!allow_opt_inputs && !allow_opt_datatype) || !BeginPopup("context"))
        return;
    ImGuiContext& g = *GImGui;
    ImGuiColorEditFlags opts = g.ColorEditOptions;
    if (allow_opt_inputs)
    {
        if (RadioButton("RGB", (opts & ImGuiColorEditFlags_DisplayRGB) != 0)) opts = (opts & ~ImGuiColorEditFlags__DisplayMask) | ImGuiColorEditFlags_DisplayRGB;
        if (RadioButton("HSV", (opts & ImGuiColorEditFlags_DisplayHSV) != 0)) opts = (opts & ~ImGuiColorEditFlags__DisplayMask) | ImGuiColorEditFlags_DisplayHSV;
        if (RadioButton("Hex", (opts & ImGuiColorEditFlags_DisplayHex) != 0)) opts = (opts & ~ImGuiColorEditFlags__DisplayMask) | ImGuiColorEditFlags_DisplayHex;
    }
    if (allow_opt_datatype)
    {
        if (allow_opt_inputs) Separator();
        if (RadioButton("0..255",     (opts & ImGuiColorEditFlags_Uint8) != 0)) opts = (opts & ~ImGuiColorEditFlags__DataTypeMask) | ImGuiColorEditFlags_Uint8;
        if (RadioButton("0.00..1.00", (opts & ImGuiColorEditFlags_Float) != 0)) opts = (opts & ~ImGuiColorEditFlags__DataTypeMask) | ImGuiColorEditFlags_Float;
    }

    if (allow_opt_inputs || allow_opt_datatype)
        Separator();
    if (Button("Copy as..", ImVec2(-1,0)))
        OpenPopup("Copy");
    if (BeginPopup("Copy"))
    {
        int cr = IM_F32_TO_INT8_SAT(col[0]), cg = IM_F32_TO_INT8_SAT(col[1]), cb = IM_F32_TO_INT8_SAT(col[2]), ca = (flags & ImGuiColorEditFlags_NoAlpha) ? 255 : IM_F32_TO_INT8_SAT(col[3]);
        char buf[64];
        ImFormatString(buf, IM_ARRAYSIZE(buf), "(%.3ff, %.3ff, %.3ff, %.3ff)", col[0], col[1], col[2], (flags & ImGuiColorEditFlags_NoAlpha) ? 1.0f : col[3]);
        if (Selectable(buf))
            SetClipboardText(buf);
        ImFormatString(buf, IM_ARRAYSIZE(buf), "(%d,%d,%d,%d)", cr, cg, cb, ca);
        if (Selectable(buf))
            SetClipboardText(buf);
        if (flags & ImGuiColorEditFlags_NoAlpha)
            ImFormatString(buf, IM_ARRAYSIZE(buf), "0x%02X%02X%02X", cr, cg, cb);
        else
            ImFormatString(buf, IM_ARRAYSIZE(buf), "0x%02X%02X%02X%02X", cr, cg, cb, ca);
        if (Selectable(buf))
            SetClipboardText(buf);
        EndPopup();
    }

    g.ColorEditOptions = opts;
    EndPopup();
}